

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoGeneric::SetVariables
          (ChConstraintTwoGeneric *this,ChVariables *mvariables_a,ChVariables *mvariables_b)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  
  if (mvariables_a == (ChVariables *)0x0 || mvariables_b == (ChVariables *)0x0) {
    (this->super_ChConstraintTwo).super_ChConstraint.valid = false;
    (this->super_ChConstraintTwo).super_ChConstraint.active = false;
  }
  else {
    (this->super_ChConstraintTwo).super_ChConstraint.valid = true;
    if ((((this->super_ChConstraintTwo).super_ChConstraint.disabled == false) &&
        ((this->super_ChConstraintTwo).super_ChConstraint.redundant == false)) &&
       ((this->super_ChConstraintTwo).super_ChConstraint.broken == false)) {
      bVar3 = (this->super_ChConstraintTwo).super_ChConstraint.mode != CONSTRAINT_FREE;
    }
    else {
      bVar3 = false;
    }
    (this->super_ChConstraintTwo).super_ChConstraint.active = bVar3;
    (this->super_ChConstraintTwo).variables_a = mvariables_a;
    (this->super_ChConstraintTwo).variables_b = mvariables_b;
    iVar2 = (*mvariables_a->_vptr_ChVariables[2])(mvariables_a);
    if (0 < iVar2) {
      iVar2 = (*((this->super_ChConstraintTwo).variables_a)->_vptr_ChVariables[2])();
      Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                (&(this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,
                 (long)iVar2);
      iVar2 = (*((this->super_ChConstraintTwo).variables_a)->_vptr_ChVariables[2])();
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)iVar2);
      lVar1 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols;
      if (lVar1 < 0) goto LAB_007d5898;
      if (lVar1 != 0) {
        memset((this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
               .m_data,0,lVar1 << 3);
      }
    }
    iVar2 = (*((this->super_ChConstraintTwo).variables_b)->_vptr_ChVariables[2])();
    if (0 < iVar2) {
      iVar2 = (*((this->super_ChConstraintTwo).variables_b)->_vptr_ChVariables[2])();
      Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                (&(this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,
                 (long)iVar2);
      iVar2 = (*((this->super_ChConstraintTwo).variables_b)->_vptr_ChVariables[2])();
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)iVar2);
      lVar1 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols;
      if (lVar1 < 0) {
LAB_007d5898:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
                     );
      }
      if (lVar1 != 0) {
        memset((this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
               .m_data,0,lVar1 << 3);
        return;
      }
    }
  }
  return;
}

Assistant:

void ChConstraintTwoGeneric::SetVariables(ChVariables* mvariables_a, ChVariables* mvariables_b) {
    if (!mvariables_a || !mvariables_b) {
        SetValid(false);
        return;
    }

    SetValid(true);
    variables_a = mvariables_a;
    variables_b = mvariables_b;

    if (variables_a->Get_ndof() > 0) {
        Cq_a.resize(variables_a->Get_ndof());
        Eq_a.resize(variables_a->Get_ndof());
        Cq_a.setZero();
    }

    if (variables_b->Get_ndof() > 0) {
        Cq_b.resize(variables_b->Get_ndof());
        Eq_b.resize(variables_b->Get_ndof());
        Cq_b.setZero();
    }
}